

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int encoder_append_uint_value(ndn_encoder_t *encoder,uint64_t value)

{
  int iVar1;
  byte bVar2;
  int i;
  long lVar3;
  
  if (value < 0x100) {
    iVar1 = encoder_append_byte_value(encoder,(uint8_t)value);
    return iVar1;
  }
  if (value < 0x10000) {
    if (encoder->offset + 2 <= encoder->output_max_size) {
      encoder->output_value[encoder->offset] = (uint8_t)(value >> 8);
      encoder->output_value[encoder->offset + 1] = (uint8_t)value;
      encoder->offset = encoder->offset + 2;
      return 0;
    }
  }
  else {
    if (value >> 0x20 == 0) {
      iVar1 = encoder_append_uint32_value(encoder,(uint32_t)value);
      return iVar1;
    }
    if (encoder->offset + 8 <= encoder->output_max_size) {
      bVar2 = 0x38;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        encoder->output_value[encoder->offset + (int)lVar3] = (uint8_t)(value >> (bVar2 & 0x3f));
        bVar2 = bVar2 - 8;
      }
      encoder->offset = encoder->offset + 8;
      return 0;
    }
  }
  return -10;
}

Assistant:

static inline int
encoder_append_uint_value(ndn_encoder_t* encoder, uint64_t value)
{
  if (value <= 255) {
    return encoder_append_byte_value(encoder, (uint8_t)value);
  }
  else if (value <= 0xFFFF) {
    return encoder_append_uint16_value(encoder, (uint16_t)value);
  }
  else if (value <= 0xFFFFFFFF) {
    return encoder_append_uint32_value(encoder, (uint32_t)value);
  }
  else {
    return encoder_append_uint64_value(encoder, value);
  }
}